

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCachePop(Parse *pParse,int N)

{
  yColCache *local_20;
  yColCache *p;
  int i;
  int N_local;
  Parse *pParse_local;
  
  pParse->iCacheLevel = pParse->iCacheLevel - N;
  local_20 = pParse->aColCache;
  for (p._0_4_ = 0; (int)p < 10; p._0_4_ = (int)p + 1) {
    if ((local_20->iReg != 0) && (pParse->iCacheLevel < local_20->iLevel)) {
      cacheEntryClear(pParse,local_20);
      local_20->iReg = 0;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCachePop(Parse *pParse, int N){
  int i;
  struct yColCache *p;
  assert( N>0 );
  assert( pParse->iCacheLevel>=N );
  pParse->iCacheLevel -= N;
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    if( p->iReg && p->iLevel>pParse->iCacheLevel ){
      cacheEntryClear(pParse, p);
      p->iReg = 0;
    }
  }
}